

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsseval.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uchar *k_00;
  FILE *__stream;
  char **ppcVar2;
  AES_KEY *key_00;
  block alVar3;
  int local_554;
  int totalblocknumber;
  int j;
  block *resf;
  FILE *fp;
  uchar *k;
  char filename [1001];
  int n;
  AES_KEY key;
  block userkey;
  longlong userkey2;
  longlong userkey1;
  char **argv_local;
  int argc_local;
  
  ppcVar2 = argv;
  alVar3 = dpf_seed((block *)0x0);
  AES_set_encrypt_key((uchar *)(filename + 1000),(int)ppcVar2,alVar3[1]);
  if (argc != 3) {
    printf("format: fsseval N filename\n");
    exit(0);
  }
  __isoc99_sscanf(argv[1],"%d",filename + 0x3e4);
  __isoc99_sscanf(argv[2],"%s",&k);
  iVar1 = getsize(filename._996_4_);
  k_00 = (uchar *)malloc((long)iVar1);
  if (k_00 == (uchar *)0x0) {
    printf("Failed to allocate a memory space.\n");
    exit(0);
  }
  __stream = fopen((char *)&k,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Failed to open the file.\n");
    exit(0);
  }
  iVar1 = getsize(filename._996_4_);
  fread(k_00,(long)iVar1,1,__stream);
  fclose(__stream);
  key_00 = (AES_KEY *)(filename + 1000);
  EVALFULL(key_00,k_00);
  for (local_554 = 0; local_554 < (1 << (filename[0x3e4] & 0x1fU)) / 0x80; local_554 = local_554 + 1
      ) {
    alVar3[1] = (longlong)k_00;
    alVar3[0] = (longlong)key_00;
    dpf_cbnotnewline(alVar3);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv){
	long long userkey1 = 597349; long long userkey2 = 121379; 
	block userkey = dpf_make_block(userkey1, userkey2);

	dpf_seed(NULL);

	AES_KEY key;
	AES_set_encrypt_key(userkey, &key);

	if(argc != 3){
		printf("format: fsseval N filename\n");
		exit(0);
	}

	int n;
	char filename[1001];
	sscanf(argv[1], "%d", &n);
	sscanf(argv[2], "%s", filename);

	unsigned char *k = (unsigned char*) malloc(getsize(n));

	if(k == NULL){
		printf("Failed to allocate a memory space.\n");
		exit(0);
	}

	FILE *fp = fopen(filename, "rb");

	if(fp == NULL){
		printf("Failed to open the file.\n");
		exit(0);
	}

	fread(k, getsize(n), 1, fp);
	fclose(fp);

	block *resf;
	resf = EVALFULL(&key, k);

	int j;
	int totalblocknumber = (1 << n) / 128;
	for(j = 0; j < totalblocknumber; j++){
		dpf_cbnotnewline(resf[j]);
	}

	return 0;
}